

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-magic.c
# Opt level: O0

int borg_get_spell_number(borg_spells spell)

{
  int local_18;
  int spell_num;
  int total_spells;
  borg_spells spell_local;
  
  if (borg_magics != (borg_magic *)0x0) {
    for (local_18 = 0; local_18 < (player->class->magic).total_spells; local_18 = local_18 + 1) {
      if (borg_magics[local_18].spell_enum == spell) {
        return local_18;
      }
    }
  }
  return -1;
}

Assistant:

static int borg_get_spell_number(const enum borg_spells spell)
{
    /* The borg must be able to "cast" spells */
    if (borg_magics == NULL)
        return -1;

    int total_spells = player->class->magic.total_spells;
    for (int spell_num = 0; spell_num < total_spells; spell_num++) {
        if (borg_magics[spell_num].spell_enum == spell)
            return spell_num;
    }

    return -1;
}